

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_subd_fragment.cpp
# Opt level: O2

bool __thiscall ON_SubDMeshFragment::IsFullFaceFragment(ON_SubDMeshFragment *this)

{
  bool bVar1;
  bool bVar2;
  
  bVar1 = false;
  bVar2 = false;
  if ((((this->m_face != (ON_SubDFace *)0x0) && (bVar2 = bVar1, this->m_face->m_edge_count == 4)) &&
      (*(long *)this->m_face_vertex_index == 0x3000200010000)) &&
     (((this->m_face_fragment_count == 1 && (this->m_face_fragment_index == 0)) &&
      ((this->m_grid).m_side_segment_count != '\0')))) {
    bVar2 = (this->m_grid).m_S != (uint *)0x0;
  }
  return bVar2;
}

Assistant:

bool ON_SubDMeshFragment::IsFullFaceFragment() const
{
  return
    nullptr != m_face
    && 4 == m_face->m_edge_count
    && 1 == m_face_fragment_count
    && 0 == m_face_fragment_index
    && 0 == m_face_vertex_index[0]
    && 1 == m_face_vertex_index[1]
    && 2 == m_face_vertex_index[2]
    && 3 == m_face_vertex_index[3]
    && m_grid.m_side_segment_count > 0 && nullptr != m_grid.m_S
    ;
}